

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O2

Vec_Str_t *
Glucose_GenerateCubes
          (bmcg_sat_solver **pSat,Vec_Int_t *vCiSatVars,Vec_Int_t *vVar2Index,int CubeLimit)

{
  int nCap;
  int *plits;
  char *__s;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Str_t *p;
  Vec_Int_t *p_00;
  Vec_Str_t *p_01;
  size_t sVar5;
  char Fill;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  
  nCap = vCiSatVars->nSize;
  p = Vec_StrAlloc(1000);
  p_00 = Vec_IntAlloc(nCap);
  p_01 = Vec_StrAlloc(nCap + 4);
  Vec_StrFill(p_01,nCap,Fill);
  Vec_StrPrintF(p_01," 1\n");
  iVar7 = 0;
  do {
    if (CubeLimit <= iVar7 && CubeLimit != 0) break;
    iVar1 = glucose_solver_solve((SimpSolver *)pSat[1],(int *)0x0,0);
    if (iVar1 != 1) {
      if (iVar1 != -1) {
        __assert_fail("status == GLUCOSE_SAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/AbcGlucose.cpp"
                      ,0x2fb,
                      "Vec_Str_t *Glucose_GenerateCubes(bmcg_sat_solver **, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      break;
    }
    p_00->nSize = 0;
    for (iVar1 = 0; iVar1 < vCiSatVars->nSize; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(vCiSatVars,iVar1);
      uVar3 = glucose_solver_read_cex_varvalue((SimpSolver *)pSat[1],iVar2);
      iVar2 = Abc_Var2Lit(iVar2,uVar3 ^ 1);
      Vec_IntPush(p_00,iVar2);
    }
    plits = p_00->pArray;
    iVar1 = p_00->nSize;
    uVar3 = bmcg_sat_solver_minimize_assumptions(*pSat,plits,iVar1,0);
    if (iVar1 < (int)uVar3) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    p_00->nSize = uVar3;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar6 = extraout_RDX;
    for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
      iVar1 = Abc_LitNot(plits[uVar8]);
      plits[uVar8] = iVar1;
      uVar6 = extraout_RDX_00;
    }
    Vec_StrFill(p_01,nCap,(char)uVar6);
    iVar1 = 0;
    for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
      iVar2 = Abc_Lit2Var(plits[uVar8]);
      uVar4 = Vec_IntEntry(vVar2Index,iVar2);
      if (uVar4 != 0xffffffff) {
        iVar2 = plits[uVar8];
        plits[iVar1] = iVar2;
        if (((int)uVar4 < 0) || (nCap <= (int)uVar4)) {
          __assert_fail("Index >= 0 && Index < nSupp",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/AbcGlucose.cpp"
                        ,0x316,
                        "Vec_Str_t *Glucose_GenerateCubes(bmcg_sat_solver **, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        iVar2 = Abc_LitIsCompl(iVar2);
        if (p_01->nSize <= (int)uVar4) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        iVar1 = iVar1 + 1;
        p_01->pArray[uVar4] = (byte)iVar2 | 0x30;
      }
    }
    __s = p_01->pArray;
    sVar5 = strlen(__s);
    uVar8 = sVar5 & 0xffffffff;
    if ((int)sVar5 < 1) {
      uVar8 = 0;
    }
    for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      Vec_StrPush(p,__s[uVar9]);
    }
    iVar1 = glucose_solver_addclause((SimpSolver *)pSat[1],plits,iVar1);
    iVar7 = iVar7 + 1;
  } while (iVar1 != 0);
  Vec_IntFree(p_00);
  Vec_StrFree(p_01);
  Vec_StrPush(p,'\0');
  return p;
}

Assistant:

Vec_Str_t * Glucose_GenerateCubes( bmcg_sat_solver * pSat[2], Vec_Int_t * vCiSatVars, Vec_Int_t * vVar2Index, int CubeLimit )
{
    int fCreatePrime = 1;
    int nCubes, nSupp = Vec_IntSize(vCiSatVars);
    Vec_Str_t * vSop  = Vec_StrAlloc( 1000 );
    Vec_Int_t * vLits = Vec_IntAlloc( nSupp );
    Vec_Str_t * vCube = Vec_StrAlloc( nSupp + 4 );
    Vec_StrFill( vCube, nSupp, '-' );
    Vec_StrPrintF( vCube, " 1\n\0" );
    for ( nCubes = 0; !CubeLimit || nCubes < CubeLimit; nCubes++ )
    {
        int * pFinal, nFinal, iVar, i, k = 0;
        // generate onset minterm
        int status = bmcg_sat_solver_solve( pSat[1], NULL, 0 );
        if ( status == GLUCOSE_UNSAT )
            break;
        assert( status == GLUCOSE_SAT );
        Vec_IntClear( vLits );
        Vec_IntForEachEntry( vCiSatVars, iVar, i )
            Vec_IntPush( vLits, Abc_Var2Lit(iVar, !bmcg_sat_solver_read_cex_varvalue(pSat[1], iVar)) );
        // expand against offset
        if ( fCreatePrime )
        {
            nFinal = bmcg_sat_solver_minimize_assumptions( pSat[0], Vec_IntArray(vLits), Vec_IntSize(vLits), 0 );
            Vec_IntShrink( vLits, nFinal );
            pFinal = Vec_IntArray( vLits );
            for ( i = 0; i < nFinal; i++ )
                pFinal[i] = Abc_LitNot(pFinal[i]);
        }
        else
        {
            status = bmcg_sat_solver_solve( pSat[0], Vec_IntArray(vLits), Vec_IntSize(vLits) );
            assert( status == GLUCOSE_UNSAT );
            nFinal = bmcg_sat_solver_final( pSat[0], &pFinal );
        }
        // print cube
        Vec_StrFill( vCube, nSupp, '-' );
        for ( i = 0; i < nFinal; i++ )
        {
            int Index = Vec_IntEntry(vVar2Index, Abc_Lit2Var(pFinal[i]));
            if ( Index == -1 )
                continue;
            pFinal[k++] = pFinal[i];
            assert( Index >= 0 && Index < nSupp );
            Vec_StrWriteEntry( vCube, Index, (char)('0' + Abc_LitIsCompl(pFinal[i])) );
        }
        nFinal = k;
        Vec_StrAppend( vSop, Vec_StrArray(vCube) );
        //printf( "%s\n", Vec_StrArray(vCube) );
        // add blocking clause
        if ( !bmcg_sat_solver_addclause( pSat[1], pFinal, nFinal ) )
            break;
    }
    Vec_IntFree( vLits );
    Vec_StrFree( vCube );
    Vec_StrPush( vSop, '\0' );
    return vSop;
}